

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-obj.c
# Opt level: O2

wchar_t inven_damage(player *p,wchar_t type,wchar_t cperc)

{
  ulong uVar1;
  short sVar2;
  undefined2 uVar3;
  object *poVar4;
  object *poVar5;
  player_upkeep *ppVar6;
  object *poVar7;
  _Bool _Var8;
  char cVar9;
  short sVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  undefined4 uVar13;
  char *pcVar14;
  object *obj;
  char *pcVar15;
  char cVar16;
  long lVar17;
  uint uVar18;
  char *pcVar19;
  long lStackY_e0;
  _Bool none_left;
  wchar_t local_b4;
  player *local_b0;
  wchar_t local_a4;
  long local_a0;
  wchar_t local_98;
  undefined4 local_94;
  object *destroyed;
  char o_name [80];
  
  if (cperc < L'\x01') {
    return L'\0';
  }
  local_a0 = (long)type;
  local_98 = (uint)cperc >> 2;
  local_a4 = L'\0';
  poVar7 = p->gear;
  lVar17 = local_a0;
  local_b4 = cperc;
  local_b0 = p;
LAB_001a5b5c:
  while( true ) {
    do {
      obj = poVar7;
      if (obj == (object *)0x0) {
        return local_a4;
      }
      poVar4 = obj->next;
      _Var8 = object_is_equipped(p->body,obj);
      poVar7 = poVar4;
    } while (((_Var8) || (obj->artifact != (artifact *)0x0)) ||
            ((obj->el_info[lVar17].flags & 3) != 1));
    _Var8 = tval_is_weapon(obj);
    if ((!_Var8) || (_Var8 = tval_is_ammo(obj), _Var8)) break;
    wVar11 = Rand_div(10000);
    if (wVar11 < cperc) {
      uVar3 = obj->to_h;
      obj->to_h = uVar3 + -1;
      poVar5 = local_b0->obj_k;
      if (poVar5->to_h != 0) {
        obj->known->to_h = uVar3 + -1;
      }
      sVar10 = obj->to_d + -1;
      obj->to_d = sVar10;
      sVar2 = poVar5->to_d;
      lStackY_e0 = 0x4a;
      goto LAB_001a5c90;
    }
  }
  _Var8 = tval_is_armor(obj);
  if (_Var8) goto code_r0x001a5bc3;
  _Var8 = tval_is_rod(obj);
  if (_Var8) {
    cperc = local_98;
  }
  wVar11 = L'\0';
  for (uVar18 = 0; uVar18 < obj->number; uVar18 = uVar18 + 1) {
    wVar12 = Rand_div(10000);
    wVar11 = wVar11 + (uint)(wVar12 < cperc);
  }
  uVar13 = 0;
  lVar17 = local_a0;
  cperc = local_b4;
  goto LAB_001a5cba;
code_r0x001a5bc3:
  wVar11 = Rand_div(10000);
  if (wVar11 < cperc) {
    sVar10 = obj->to_a + -1;
    obj->to_a = sVar10;
    sVar2 = local_b0->obj_k->to_a;
    lStackY_e0 = 0x46;
LAB_001a5c90:
    if (sVar2 != 0) {
      *(short *)(obj->known->flags + lStackY_e0 + -0x4c) = sVar10;
    }
    ppVar6 = local_b0->upkeep;
    uVar1._0_4_ = ppVar6->update;
    uVar1._4_4_ = ppVar6->redraw;
    ppVar6->update = (int)(uVar1 | 0x4000000000001);
    ppVar6->redraw = (int)((uVar1 | 0x4000000000001) >> 0x20);
    wVar11 = (wchar_t)obj->number;
    uVar13 = (undefined4)CONCAT71((int7)((ulong)ppVar6 >> 8),1);
LAB_001a5cba:
    if (wVar11 != L'\0') {
      none_left = false;
      local_94 = uVar13;
      object_desc(o_name,0x50,obj,0,local_b0);
      pcVar19 = "Y";
      if (((1 < obj->number) && (pcVar19 = "All of y", wVar11 != (uint)obj->number)) &&
         (pcVar19 = "One of y", L'\x01' < wVar11)) {
        pcVar19 = "Some of y";
      }
      cVar9 = gear_to_label(local_b0,obj);
      pcVar15 = "was";
      if (L'\x01' < wVar11) {
        pcVar15 = "were";
      }
      cVar16 = (char)local_94;
      pcVar14 = "destroyed";
      if (cVar16 != '\0') {
        pcVar14 = "damaged";
      }
      msgt(0x21,"%sour %s (%c) %s %s!",pcVar19,o_name,(ulong)(uint)(int)cVar9,pcVar15,pcVar14);
      poVar7 = obj;
      lVar17 = local_a0;
      cperc = local_b4;
      if (cVar16 == '\0') {
        destroyed = gear_object_for_use(local_b0,obj,wVar11,false,&none_left);
        cperc = local_b4;
        if (destroyed->known != (object *)0x0) {
          object_delete((chunk *)0x0,(chunk *)0x0,&destroyed->known);
        }
        object_delete((chunk *)0x0,(chunk *)0x0,&destroyed);
        local_a4 = local_a4 + wVar11;
        poVar7 = poVar4;
        lVar17 = local_a0;
      }
    }
  }
  goto LAB_001a5b5c;
}

Assistant:

int inven_damage(struct player *p, int type, int cperc)
{
	int j, k, amt;
	struct object *obj = p->gear;
	char o_name[80];
	bool damage;

	/* No chance means no damage */
	if (cperc <= 0)
		return 0;

	/* Count the casualties */
	k = 0;

	/* Scan through the gear */
	while (obj) {
		struct object *next = obj->next;
		if (object_is_equipped(p->body, obj)) {
			obj = next;
			continue;
		}

		/* Hack -- for now, skip artifacts */
		if (obj->artifact) {
			obj = next;
			continue;
		}

		/* Give this item slot a shot at death if it is vulnerable */
		if ((obj->el_info[type].flags & EL_INFO_HATES) &&
			!(obj->el_info[type].flags & EL_INFO_IGNORE)) {
			/* Chance to destroy this item */
			int chance = cperc;

			/* Track if it is damaged instead of destroyed */
			damage = false;

			/* Analyze the type to see if we just damage it
			 * - we also check for rods to reduce chance */
			if (tval_is_weapon(obj) && !tval_is_ammo(obj)) {
				/* Chance to damage it */
				if (randint0(10000) < cperc) {
					/* Damage the item */
					obj->to_h--;
					if (p->obj_k->to_h)
						obj->known->to_h = obj->to_h;
					obj->to_d--;
					if (p->obj_k->to_d)
						obj->known->to_d = obj->to_d;

					/* Damaged! */
					damage = true;
				} else {
					obj = next;
					continue;
				}
			} else if (tval_is_armor(obj)) {
				/* Chance to damage it */
				if (randint0(10000) < cperc) {
					/* Damage the item */
					obj->to_a--;
					if (p->obj_k->to_a)
						obj->known->to_a = obj->to_a;

					/* Damaged! */
					damage = true;
				} else {
					obj = next;
					continue;
				}
			} else if (tval_is_rod(obj)) {
				chance = (chance / 4);
			}


			/* Damage instead of destroy */
			if (damage) {
				p->upkeep->update |= (PU_BONUS);
				p->upkeep->redraw |= (PR_EQUIP);

				/* Casualty count */
				amt = obj->number;
			} else
				/* ... or count the casualties */
				for (amt = j = 0; j < obj->number; ++j)
					if (randint0(10000) < chance) amt++;

			/* Some casualities */
			if (amt) {
				struct object *destroyed;
				bool none_left = false;

				/* Get a description */
				object_desc(o_name, sizeof(o_name), obj,
					ODESC_BASE, p);

				/* Message */
				msgt(MSG_DESTROY, "%sour %s (%c) %s %s!",
				           ((obj->number > 1) ?
				            ((amt == obj->number) ? "All of y" :
				             (amt > 1 ? "Some of y" : "One of y")) : "Y"),
				           o_name, gear_to_label(p, obj),
				           ((amt > 1) ? "were" : "was"),
					   (damage ? "damaged" : "destroyed"));

				/* Damage already done? */
				if (damage)
					continue;

				/* Destroy "amt" items */
				destroyed = gear_object_for_use(p, obj, amt,
					false, &none_left);
				if (destroyed->known)
					object_delete(NULL, NULL, &destroyed->known);
				object_delete(NULL, NULL, &destroyed);

				/* Count the casualties */
				k += amt;
			}
		}
		obj = next;
	}

	/* Return the casualty count */
	return (k);
}